

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_WriteBooth(FILE *pFile,int nVars)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar6 = nVars;
  if (1 < (uint)nVars) {
    uVar6 = 0;
    uVar3 = nVars - 1;
    do {
      uVar6 = uVar6 + 1;
      bVar10 = 9 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar10);
  }
  if (nVars != 0) {
    uVar3 = nVars * 2;
    uVar4 = (ulong)(uVar3 - 1);
    uVar5 = 0;
    do {
      uVar2 = (uint)uVar4;
      uVar4 = uVar4 / 10;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (9 < uVar2);
    if (0 < nVars) {
      uVar2 = (nVars - (nVars + 1 >> 0x1f)) + 1 >> 1;
      fprintf((FILE *)pFile,".model Multi%d\n",nVars);
      fwrite(".inputs",7,1,(FILE *)pFile);
      uVar4 = 0;
      do {
        fprintf((FILE *)pFile," a%0*d",(ulong)uVar6,uVar4);
        uVar8 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar8;
      } while (nVars != uVar8);
      uVar8 = 0;
      do {
        fprintf((FILE *)pFile," b%0*d",(ulong)uVar6,(ulong)uVar8);
        uVar8 = uVar8 + 1;
      } while (nVars != uVar8);
      fputc(10,(FILE *)pFile);
      fwrite(".outputs",8,1,(FILE *)pFile);
      uVar8 = 1;
      if (1 < (int)uVar3) {
        uVar8 = uVar3;
      }
      uVar9 = 0;
      do {
        fprintf((FILE *)pFile," m%0*d",uVar5,(ulong)uVar9);
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      fputc(10,(FILE *)pFile);
      Abc_WriteBoothPartialProducts(pFile,nVars);
      uVar4 = 0;
      do {
        fprintf((FILE *)pFile,".names x%0*d_%0*d\n",(ulong)uVar6,0,uVar5,uVar4);
        uVar9 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar9;
      } while (uVar8 != uVar9);
      uVar9 = 0;
      if (0 < (int)uVar3) {
        uVar9 = uVar3;
      }
      uVar1 = 0;
      do {
        fprintf((FILE *)pFile,".subckt ADD%d",(ulong)uVar3);
        uVar4 = 0;
        do {
          fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",uVar5,uVar4,(ulong)uVar6,(ulong)uVar1,uVar5,
                  uVar4);
          uVar7 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar7;
        } while (uVar8 != uVar7);
        uVar4 = 0;
        do {
          fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",uVar5,uVar4,(ulong)uVar6,(ulong)uVar1,uVar5,
                  uVar4);
          uVar7 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar7;
        } while (uVar8 != uVar7);
        uVar4 = 0;
        do {
          fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",uVar5,uVar4,(ulong)uVar6,(ulong)(uVar1 + 1),
                  uVar5,uVar4);
          uVar7 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar7;
        } while (uVar9 + 1 != uVar7);
        fputc(10,(FILE *)pFile);
        bVar10 = uVar1 != uVar2;
        uVar1 = uVar1 + 1;
      } while (bVar10);
      uVar8 = 1;
      if (1 < (int)uVar3) {
        uVar8 = uVar3;
      }
      uVar4 = 0;
      do {
        fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",(ulong)uVar6,(ulong)(uVar2 + 1),uVar5
                ,uVar4,uVar5,uVar4);
        uVar9 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar9;
      } while (uVar8 != uVar9);
      fwrite(".end\n",5,1,(FILE *)pFile);
      fputc(10,(FILE *)pFile);
      Abc_WriteAdder(pFile,uVar3);
      return;
    }
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x448,"void Abc_WriteBooth(FILE *, int)");
}

Assistant:

void Abc_WriteBooth( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );
    int Length = 1+(nVars + 1)/2;

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    Abc_WriteBoothPartialProducts( pFile, nVars );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < Length; k++ )
    {
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}